

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testresult.cpp
# Opt level: O1

void __thiscall trun::TestResult::TestResult(TestResult *this,string *use_symbolName)

{
  (this->assertError)._vptr_AssertError = (_func_int **)&PTR__AssertError_001e1c68;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->errorString)._M_dataplus._M_p = (pointer)&(this->errorString).field_2;
  (this->errorString)._M_string_length = 0;
  (this->errorString).field_2._M_local_buf[0] = '\0';
  this->failState = None;
  this->testResult = kTestResult_NotExecuted;
  this->tElapsedSec = 0.0;
  this->numError = 0;
  this->numAssert = 0;
  (this->symbolName)._M_dataplus._M_p = (pointer)&(this->symbolName).field_2;
  (this->symbolName)._M_string_length = 0;
  (this->symbolName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->symbolName,use_symbolName);
  this->numError = 0;
  this->numAssert = 0;
  return;
}

Assistant:

TestResult::TestResult(const std::string &use_symbolName) {
    testResult = kTestResult_NotExecuted;
    symbolName = use_symbolName;
    numError = numAssert = 0;
}